

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  pointer pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  pointer puVar6;
  char *pcVar7;
  uint uVar8;
  size_t __n;
  pointer puVar9;
  size_t totalsize;
  size_t sVar10;
  anon_union_4_2_77b30072 flag_struct;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  void *ptr;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  uint local_4b4;
  undefined8 local_4b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4a8;
  pointer local_488;
  pointer puStack_480;
  undefined8 local_478;
  undefined4 local_470;
  long *local_468;
  undefined4 local_460;
  int local_45c;
  undefined8 local_458;
  size_t local_450;
  size_t local_440;
  vector<signed_char,_std::allocator<signed_char>_> local_438;
  undefined4 local_420;
  long *local_418;
  undefined4 local_410;
  int local_40c;
  undefined8 local_408;
  size_t local_400;
  
  if (type == 1) {
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
    local_420 = 1;
    local_418 = (long *)0x0;
    local_410 = 1;
    local_408 = 0x100000001;
    sVar10 = (size_t)w;
    local_400 = sVar10;
    if (w == 0) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->elempack = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar10;
      local_40c = w;
    }
    else {
      local_488 = (pointer)0x0;
      local_40c = w;
      iVar4 = posix_memalign(&local_488,0x10,sVar10 * 4 + 4);
      puVar6 = (pointer)0x0;
      if (iVar4 == 0) {
        puVar6 = local_488;
      }
      puVar9 = puVar6 + sVar10 * 2;
      puVar9[0] = 1;
      puVar9[1] = 0;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar6;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar9;
      uVar2 = (*this->dr->_vptr_DataReader[3])(this->dr,local_488,(ulong)(uint)(w * 4));
      if (uVar2 == w * 4) {
        __return_storage_ptr__->data = puVar6;
        __return_storage_ptr__->refcount = (int *)puVar9;
        __return_storage_ptr__->elemsize = 4;
        __return_storage_ptr__->elempack = 1;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 1;
        __return_storage_ptr__->w = w;
        __return_storage_ptr__->h = 1;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = sVar10;
        LOCK();
        *(int *)(puVar6 + sVar10 * 2) = *(int *)(puVar6 + sVar10 * 2) + 1;
        UNLOCK();
      }
      else {
        fprintf(_stderr,"ModelBin read weight_data failed %d\n",(ulong)uVar2);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
      }
    }
    if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
         *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish != 0) {
      return __return_storage_ptr__;
    }
    puVar6 = (pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    if (local_418 != (long *)0x0) {
      (**(code **)(*local_418 + 0x18))();
      return __return_storage_ptr__;
    }
LAB_001248b6:
    if (puVar6 != (pointer)0x0) {
      free(puVar6);
    }
  }
  else {
    if (type == 0) {
      uVar2 = (*this->dr->_vptr_DataReader[3])(this->dr,&local_4b4,4);
      if (uVar2 == 4) {
        if (local_4b4 == 0x2c056) {
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
          local_420 = 1;
          local_418 = (long *)0x0;
          local_410 = 1;
          local_408 = 0x100000001;
          sVar10 = (size_t)w;
          local_400 = sVar10;
          if (w == 0) {
            __return_storage_ptr__->data = (void *)0x0;
            __return_storage_ptr__->refcount = (int *)0x0;
            __return_storage_ptr__->elemsize = 4;
            __return_storage_ptr__->elempack = 1;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            __return_storage_ptr__->w = 0;
            __return_storage_ptr__->h = 1;
            __return_storage_ptr__->c = 1;
            __return_storage_ptr__->cstep = sVar10;
            local_40c = w;
          }
          else {
            local_488 = (pointer)0x0;
            local_40c = w;
            iVar4 = posix_memalign(&local_488,0x10,sVar10 * 4 + 4);
            puVar6 = (pointer)0x0;
            if (iVar4 == 0) {
              puVar6 = local_488;
            }
            puVar9 = puVar6 + sVar10 * 2;
            puVar9[0] = 1;
            puVar9[1] = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)puVar6;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)puVar9;
            uVar2 = (*this->dr->_vptr_DataReader[3])(this->dr,local_488,(ulong)(uint)(w * 4));
            if (uVar2 == w * 4) {
              __return_storage_ptr__->data = puVar6;
              __return_storage_ptr__->refcount = (int *)puVar9;
              __return_storage_ptr__->elemsize = 4;
              __return_storage_ptr__->elempack = 1;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 1;
              __return_storage_ptr__->w = w;
              __return_storage_ptr__->h = 1;
              __return_storage_ptr__->c = 1;
              __return_storage_ptr__->cstep = sVar10;
              LOCK();
              *(int *)(puVar6 + sVar10 * 2) = *(int *)(puVar6 + sVar10 * 2) + 1;
              UNLOCK();
            }
            else {
              fprintf(_stderr,"ModelBin read weight_data failed %d\n",(ulong)uVar2);
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 0;
              __return_storage_ptr__->c = 0;
              __return_storage_ptr__->cstep = 0;
            }
          }
          if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            return __return_storage_ptr__;
          }
          LOCK();
          *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish =
               *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1;
          UNLOCK();
          if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish != 0) {
            return __return_storage_ptr__;
          }
          puVar6 = (pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          if (local_418 != (long *)0x0) {
            (**(code **)(*local_418 + 0x18))();
            return __return_storage_ptr__;
          }
          goto LAB_001248b6;
        }
        __n = (size_t)w;
        if (local_4b4 == 0xd4b38) {
          uVar5 = __n + 3 & 0xfffffffffffffffc;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<signed_char,_std::allocator<signed_char>_>::resize
                    (&local_438,(long)(int)(uint)uVar5);
          uVar2 = (*this->dr->_vptr_DataReader[3])
                            (this->dr,local_438.
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,__n + 3 & 0xfffffffc)
          ;
          if (uVar2 == (uint)uVar5) {
            __return_storage_ptr__->data = (void *)0x0;
            __return_storage_ptr__->refcount = (int *)0x0;
            __return_storage_ptr__->elemsize = 1;
            __return_storage_ptr__->elempack = 1;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            __return_storage_ptr__->w = w;
            __return_storage_ptr__->h = 1;
            __return_storage_ptr__->c = 1;
            __return_storage_ptr__->cstep = __n;
            if (w != 0) {
              local_488 = (pointer)0x0;
              iVar4 = posix_memalign(&local_488,0x10,uVar5 + 4);
              puVar6 = (pointer)0x0;
              if (iVar4 == 0) {
                puVar6 = local_488;
              }
              __return_storage_ptr__->data = puVar6;
              __return_storage_ptr__->refcount = (int *)((long)puVar6 + uVar5);
              pcVar1 = (pointer)((long)puVar6 + uVar5);
              pcVar1[0] = '\x01';
              pcVar1[1] = '\0';
              pcVar1[2] = '\0';
              pcVar1[3] = '\0';
              if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0) {
                memcpy(local_488,
                       local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
              }
            }
            goto LAB_00124778;
          }
          pcVar7 = "ModelBin read int8_weights failed %d\n";
        }
        else {
          if (local_4b4 != 0x1306b47) {
            uVar2 = local_4b4 >> 8;
            uVar8 = local_4b4 >> 0x10;
            local_488 = (pointer)0x0;
            puStack_480 = (pointer)0x0;
            local_478 = 4;
            local_470 = 1;
            local_468 = (long *)0x0;
            local_460 = 1;
            local_458 = 0x100000001;
            local_45c = w;
            local_450 = __n;
            if (w == 0) {
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              __return_storage_ptr__->elemsize = 4;
              __return_storage_ptr__->elempack = 1;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 1;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 1;
              __return_storage_ptr__->c = 1;
              __return_storage_ptr__->cstep = __n;
            }
            else {
              uVar3 = local_4b4 & 0xff;
              local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_4b0 = (pointer)CONCAT44(local_4b0._4_4_,local_4b4 >> 0x18);
              iVar4 = posix_memalign((void **)&local_438,0x10,__n * 4 + 4);
              puVar6 = (pointer)0x0;
              if (iVar4 == 0) {
                puVar6 = (pointer)local_438.
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
              }
              puVar9 = puVar6 + __n * 2;
              puVar9[0] = 1;
              puVar9[1] = 0;
              local_488 = puVar6;
              puStack_480 = puVar9;
              local_440 = __n;
              if ((uVar2 & 0xff) + uVar3 + (uVar8 & 0xff) == 0 && (int)local_4b0 == 0) {
                if (((char)local_4b4 == '\0') &&
                   (uVar2 = (*this->dr->_vptr_DataReader[3])
                                      (this->dr,local_438.
                                                super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                       (ulong)(uint)(w * 4)), uVar2 != w * 4)) {
                  pcVar7 = "ModelBin read weight_data failed %d\n";
                  goto LAB_001247e0;
                }
              }
              else {
                uVar2 = (*this->dr->_vptr_DataReader[3])(this->dr,&local_438,0x400);
                if (uVar2 != 0x400) {
                  pcVar7 = "ModelBin read quantization_value failed %d\n";
LAB_001247e0:
                  fprintf(_stderr,pcVar7,(ulong)uVar2);
                  __return_storage_ptr__->data = (void *)0x0;
                  __return_storage_ptr__->refcount = (int *)0x0;
                  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                  __return_storage_ptr__->allocator = (Allocator *)0x0;
                  __return_storage_ptr__->dims = 0;
                  __return_storage_ptr__->w = 0;
                  __return_storage_ptr__->h = 0;
                  __return_storage_ptr__->c = 0;
                  __return_storage_ptr__->cstep = 0;
                  goto LAB_00124890;
                }
                uVar5 = (ulong)(uint)w + 3;
                uVar8 = (uint)uVar5 & 0xfffffffc;
                local_4a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_4a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_4a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_4b0 = puVar9;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_4a8,(long)(int)uVar8);
                uVar2 = (*this->dr->_vptr_DataReader[3])
                                  (this->dr,local_4a8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                   uVar5 & 0xfffffffc);
                if (uVar2 == uVar8) {
                  if (w < 1) goto LAB_00124832;
                  uVar5 = 0;
                  do {
                    *(undefined4 *)(puVar6 + uVar5 * 2) =
                         *(undefined4 *)
                          ((long)&local_438.
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_4a8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar5] * 4);
                    uVar5 = uVar5 + 1;
                  } while ((uint)w != uVar5);
LAB_0012483c:
                  puVar9 = local_4b0;
                  operator_delete(local_4a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_4a8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_4a8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  fprintf(_stderr,"ModelBin read index_array failed %d\n",(ulong)uVar2);
                  __return_storage_ptr__->data = (void *)0x0;
                  __return_storage_ptr__->refcount = (int *)0x0;
                  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                  __return_storage_ptr__->allocator = (Allocator *)0x0;
                  __return_storage_ptr__->dims = 0;
                  __return_storage_ptr__->w = 0;
                  __return_storage_ptr__->h = 0;
                  __return_storage_ptr__->c = 0;
                  __return_storage_ptr__->cstep = 0;
LAB_00124832:
                  puVar9 = local_4b0;
                  if (local_4a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0012483c;
                }
                if (uVar2 != uVar8) goto LAB_00124890;
              }
              __return_storage_ptr__->data = puVar6;
              __return_storage_ptr__->refcount = (int *)puVar9;
              __return_storage_ptr__->elemsize = 4;
              __return_storage_ptr__->elempack = 1;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 1;
              __return_storage_ptr__->w = w;
              __return_storage_ptr__->h = 1;
              __return_storage_ptr__->c = 1;
              __return_storage_ptr__->cstep = local_440;
              LOCK();
              *(int *)(puVar6 + local_440 * 2) = *(int *)(puVar6 + local_440 * 2) + 1;
              UNLOCK();
            }
LAB_00124890:
            if (puStack_480 == (pointer)0x0) {
              return __return_storage_ptr__;
            }
            LOCK();
            *(int *)puStack_480 = *(int *)puStack_480 + -1;
            UNLOCK();
            if (*(int *)puStack_480 != 0) {
              return __return_storage_ptr__;
            }
            puVar6 = local_488;
            if (local_468 != (long *)0x0) {
              (**(code **)(*local_468 + 0x18))();
              return __return_storage_ptr__;
            }
            goto LAB_001248b6;
          }
          uVar5 = __n * 2 + 3;
          uVar8 = (uint)uVar5 & 0xfffffffc;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_438,
                     (long)(int)uVar8);
          uVar2 = (*this->dr->_vptr_DataReader[3])
                            (this->dr,local_438.
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,uVar5 & 0xfffffffc);
          if (uVar2 == uVar8) {
            Mat::from_float16(__return_storage_ptr__,
                              (unsigned_short *)
                              local_438.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start,w);
            goto LAB_00124778;
          }
          pcVar7 = "ModelBin read float16_weights failed %d\n";
        }
        fprintf(_stderr,pcVar7,(ulong)uVar2);
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
LAB_00124778:
        if ((unsigned_short *)
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
          return __return_storage_ptr__;
        }
        operator_delete(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_438.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_438.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return __return_storage_ptr__;
      }
      pcVar7 = "ModelBin read flag_struct failed %d\n";
      uVar5 = (ulong)uVar2;
    }
    else {
      pcVar7 = "ModelBin load type %d not implemented\n";
      uVar5 = (ulong)(uint)type;
    }
    fprintf(_stderr,pcVar7,uVar5);
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != (int)sizeof(flag_struct))
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = dr.read(m, w * sizeof(float));
        if (nread != w * (int)sizeof(float))
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}